

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O2

void __thiscall FDrawInfo::ClearBuffers(FDrawInfo *this)

{
  gl_subsectorrendernode *pgVar1;
  gl_subsectorrendernode *pgVar2;
  uint i;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < (this->otherfloorplanes).Count; uVar3 = uVar3 + 1) {
    pgVar2 = (this->otherfloorplanes).Array[uVar3];
    while (pgVar2 != (gl_subsectorrendernode *)0x0) {
      pgVar1 = pgVar2->next;
      operator_delete(pgVar2,0x10);
      pgVar2 = pgVar1;
    }
  }
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Clear(&this->otherfloorplanes);
  for (uVar3 = 0; uVar3 < (this->otherceilingplanes).Count; uVar3 = uVar3 + 1) {
    pgVar2 = (this->otherceilingplanes).Array[uVar3];
    while (pgVar2 != (gl_subsectorrendernode *)0x0) {
      pgVar1 = pgVar2->next;
      operator_delete(pgVar2,0x10);
      pgVar2 = pgVar1;
    }
  }
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Clear(&this->otherceilingplanes);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Clear
            (&this->MissingUpperTextures);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Clear
            (&this->MissingLowerTextures);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Clear(&this->MissingUpperSegs);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Clear(&this->MissingLowerSegs);
  TArray<FDrawInfo::SubsectorHackInfo,_FDrawInfo::SubsectorHackInfo>::Clear(&this->SubsectorHacks);
  TArray<sector_t_*,_sector_t_*>::Clear(&this->CeilingStacks);
  TArray<sector_t_*,_sector_t_*>::Clear(&this->FloorStacks);
  TArray<subsector_t_*,_subsector_t_*>::Clear(&this->HandledSubsectors);
  return;
}

Assistant:

void FDrawInfo::ClearBuffers()
{
	for(unsigned int i=0;i< otherfloorplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherfloorplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherfloorplanes.Clear();

	for(unsigned int i=0;i< otherceilingplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherceilingplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherceilingplanes.Clear();

	// clear all the lists that might not have been cleared already
	MissingUpperTextures.Clear();
	MissingLowerTextures.Clear();
	MissingUpperSegs.Clear();
	MissingLowerSegs.Clear();
	SubsectorHacks.Clear();
	CeilingStacks.Clear();
	FloorStacks.Clear();
	HandledSubsectors.Clear();

}